

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keytap2-gui.cpp
# Opt level: O0

void __thiscall TripleBuffer<stStateUI>::TripleBuffer(TripleBuffer<stStateUI> *this)

{
  long in_RDI;
  stStateUI *in_stack_00000030;
  
  stStateUI::stStateUI(in_stack_00000030);
  *(undefined1 *)(in_RDI + 0x270) = 0;
  stStateUI::stStateUI(in_stack_00000030);
  stStateUI::stStateUI(in_stack_00000030);
  std::mutex::mutex((mutex *)0x188377);
  return;
}

Assistant:

bool update(bool force = false) {
        std::lock_guard<std::mutex> lock(mutex);
        hasChanged = true || force;
        this->flags.clear();

        return true;
    }